

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fDefaultVertexAttributeTests.cpp
# Opt level: O0

Vector<int,_4> __thiscall
deqp::gles3::Functional::(anonymous_namespace)::convertToTypeVec<int,4,float,4>
          (_anonymous_namespace_ *this,Vector<float,_4> *v)

{
  float fVar1;
  int iVar2;
  int *piVar3;
  float *pfVar4;
  undefined8 extraout_RDX;
  Vector<int,_4> VVar5;
  undefined4 local_20;
  undefined4 local_1c;
  int ndx_1;
  int ndx;
  Vector<float,_4> *v_local;
  Vector<int,_4> *retVal;
  
  tcu::Vector<int,_4>::Vector((Vector<int,_4> *)this);
  for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
    piVar3 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)this,local_1c);
    *piVar3 = 0;
  }
  piVar3 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)this,3);
  *piVar3 = 1;
  local_20 = 0;
  while( true ) {
    iVar2 = de::min<int>(4,4);
    if (iVar2 <= local_20) break;
    pfVar4 = tcu::Vector<float,_4>::operator[](v,local_20);
    fVar1 = *pfVar4;
    piVar3 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)this,local_20);
    *piVar3 = (int)fVar1;
    local_20 = local_20 + 1;
  }
  VVar5.m_data[2] = (int)extraout_RDX;
  VVar5.m_data[3] = (int)((ulong)extraout_RDX >> 0x20);
  VVar5.m_data._0_8_ = this;
  return (Vector<int,_4>)VVar5.m_data;
}

Assistant:

tcu::Vector<T1, S1> convertToTypeVec (const tcu::Vector<T2, S2>& v)
{
	tcu::Vector<T1, S1> retVal;

	for (int ndx = 0; ndx < S1; ++ndx)
		retVal[ndx] = T1(0);

	if (S1 == 4)
		retVal[3] = T1(1);

	for (int ndx = 0; ndx < de::min(S1, S2); ++ndx)
		retVal[ndx] = T1(v[ndx]);

	return retVal;
}